

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_> *this)

{
  char cVar1;
  basic_format_specs<char> *spec;
  bool bVar2;
  hex_writer f;
  uint uVar3;
  uint num_digits;
  string_view prefix;
  undefined4 uStack_4;
  
  spec = this->spec;
  if ((spec->flags_ & 8) != 0) {
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = '0';
    cVar1 = spec->type_;
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = cVar1;
  }
  num_digits = 0;
  uVar3 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar2 = 0xf < uVar3;
    uVar3 = uVar3 >> 4;
  } while (bVar2);
  f._12_4_ = uStack_4;
  f.num_digits = num_digits;
  f.self = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
             this->writer,num_digits,prefix,spec,f);
  return;
}

Assistant:

void on_hex() {
      if (spec.flag(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type());
      }
      unsigned num_digits = count_digits<4>();
      writer.write_int(num_digits, get_prefix(), spec,
                       hex_writer{*this, num_digits});
    }